

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

bool cmPolicies::ApplyPolicyVersion
               (cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer,WarnCompat warnCompat)

{
  pointer pPVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmListFileContext *pcVar7;
  string *__lhs;
  cmState *this;
  cmValue cVar8;
  ostream *poVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  PolicyStatus status;
  PolicyID PVar13;
  pointer pPVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  allocator<char> local_235;
  uint local_234;
  uint local_230;
  uint local_22c;
  string defaultVar;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> ancientPolicies;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream e;
  
  if ((warnCompat == On) &&
     (((majorVer < 2 || (majorVer == 2 && minorVer < 8)) ||
      ((majorVer == 2 && ((minorVer == 8 && (patchVer < 0xc)))))))) {
    if ((minorVer == 6 && majorVer == 2) && patchVer == 0) {
      cmMakefile::GetStateSnapshot(mf);
      bVar2 = cmStateSnapshot::CanPopPolicyScope((cmStateSnapshot *)&e);
      if (bVar2) {
        cmMakefile::GetBacktrace((cmMakefile *)&defaultVar);
        pcVar7 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                           ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&defaultVar);
        iVar6 = cmsys::SystemTools::Strucmp((pcVar7->Name)._M_dataplus._M_p,"cmake_policy");
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&defaultVar._M_string_length);
        if (iVar6 == 0) goto LAB_0025d20c;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,
               "Compatibility with CMake < 2.8.12 will be removed from a future version of CMake.\nUpdate the VERSION argument <min> value or use a ...<max> suffix to tell CMake that the project does not need compatibility with older versions."
               ,(allocator<char> *)&defaultVar);
    cmMakefile::IssueMessage(mf,DEPRECATION_WARNING,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
LAB_0025d20c:
  ancientPolicies.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = 2 < majorVer;
  bVar18 = majorVer == 3;
  uVar12 = minorVer + 1;
  uVar11 = patchVer + 1;
  bVar19 = patchVer == 0xffffffff;
  bVar15 = uVar12 < 9;
  bVar20 = minorVer == 8;
  bVar16 = 1 < majorVer;
  bVar21 = majorVer != 2;
  bVar17 = 6 < uVar12;
  bVar22 = minorVer != 6;
  ancientPolicies.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ancientPolicies.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_234 = majorVer;
  local_230 = minorVer;
  local_22c = patchVer;
  for (PVar13 = CMP0000; PVar13 != CMPCOUNT; PVar13 = PVar13 + CMP0001) {
    switch(PVar13) {
    case CMP0000:
    case CMP0001:
    case CMP0002:
    case CMP0003:
    case CMP0004:
    case CMP0005:
    case CMP0006:
    case CMP0007:
      if (((bVar22 || !bVar19) && bVar17 || bVar21) && bVar16) break;
      goto LAB_0025d80b;
    case CMP0008:
      if ((uVar11 < 2 && !bVar22 || !bVar17) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0009:
      if ((uVar11 < 3 && !bVar22 || !bVar17) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0010:
    case CMP0011:
      if ((uVar11 < 4 && !bVar22 || !bVar17) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0012:
    case CMP0013:
    case CMP0014:
      if ((bVar20 && bVar19 || bVar15) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0015:
      if ((bVar20 && uVar11 < 2 || bVar15) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0016:
      if ((bVar20 && uVar11 < 4 || bVar15) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0017:
      if ((uVar11 < 5 && bVar20 || bVar15) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0018:
      if ((uVar11 < 10 && bVar20 || bVar15) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0019:
    case CMP0020:
      if ((uVar11 < 0xc && bVar20 || bVar15) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0021:
    case CMP0022:
    case CMP0023:
      if ((uVar11 < 0xd && bVar20 || bVar15) && !bVar21 || !bVar16) goto LAB_0025d80b;
      break;
    case CMP0024:
    case CMP0025:
    case CMP0026:
    case CMP0027:
    case CMP0028:
    case CMP0029:
    case CMP0030:
    case CMP0031:
    case CMP0032:
    case CMP0033:
    case CMP0034:
    case CMP0035:
    case CMP0036:
    case CMP0037:
    case CMP0038:
    case CMP0039:
    case CMP0040:
    case CMP0041:
    case CMP0042:
    case CMP0043:
    case CMP0044:
    case CMP0045:
    case CMP0046:
    case CMP0047:
    case CMP0048:
    case CMP0049:
    case CMP0050:
      bVar5 = minorVer == 0 && bVar19 || minorVer == 0xffffffff;
      goto joined_r0x0025da12;
    case CMP0051:
    case CMP0052:
    case CMP0053:
    case CMP0054:
      if ((minorVer == 1 && bVar19 || uVar12 < 2) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0055:
    case CMP0056:
      if ((minorVer == 2 && bVar19 || uVar12 < 3) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0057:
    case CMP0058:
    case CMP0059:
    case CMP0060:
    case CMP0061:
    case CMP0062:
    case CMP0063:
      if ((minorVer == 3 && bVar19 || uVar12 < 4) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0064:
    case CMP0065:
      if ((minorVer == 4 && bVar19 || uVar12 < 5) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0066:
      if ((minorVer == 7 && bVar19 || uVar12 < 8) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0067:
      if (bVar18 && (bVar20 && bVar19 || bVar15) || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0068:
    case CMP0069:
      if ((minorVer == 9 && bVar19 || uVar12 < 10) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0070:
    case CMP0071:
      if ((minorVer == 10 && bVar19 || uVar12 < 0xb) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0072:
      if ((minorVer == 0xb && bVar19 || uVar12 < 0xc) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0073:
    case CMP0074:
    case CMP0075:
      if ((minorVer == 0xc && bVar19 || uVar12 < 0xd) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0076:
    case CMP0077:
    case CMP0078:
    case CMP0079:
    case CMP0080:
    case CMP0081:
      if ((minorVer == 0xd && bVar19 || uVar12 < 0xe) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0082:
    case CMP0083:
    case CMP0084:
    case CMP0085:
    case CMP0086:
    case CMP0087:
    case CMP0088:
      if ((minorVer == 0xe && bVar19 || uVar12 < 0xf) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0089:
    case CMP0090:
    case CMP0091:
    case CMP0092:
    case CMP0093:
    case CMP0094:
      if ((minorVer == 0xf && bVar19 || uVar12 < 0x10) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0095:
    case CMP0096:
    case CMP0097:
      if ((minorVer == 0x10 && bVar19 || uVar12 < 0x11) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0098:
    case CMP0099:
    case CMP0100:
    case CMP0101:
    case CMP0102:
      if ((minorVer == 0x11 && bVar19 || uVar12 < 0x12) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0103:
    case CMP0104:
    case CMP0105:
    case CMP0106:
    case CMP0107:
    case CMP0108:
      if ((minorVer == 0x12 && bVar19 || uVar12 < 0x13) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0109:
    case CMP0110:
    case CMP0111:
    case CMP0112:
    case CMP0113:
    case CMP0114:
      if ((minorVer == 0x13 && bVar19 || uVar12 < 0x14) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0115:
    case CMP0116:
    case CMP0117:
    case CMP0118:
    case CMP0119:
    case CMP0120:
      if ((minorVer == 0x14 && bVar19 || uVar12 < 0x15) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0121:
    case CMP0122:
    case CMP0123:
    case CMP0124:
    case CMP0125:
    case CMP0126:
      if ((minorVer == 0x15 && bVar19 || uVar12 < 0x16) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0127:
    case CMP0128:
      if ((minorVer == 0x16 && bVar19 || uVar12 < 0x17) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0129:
      if ((minorVer == 0x17 && bVar19 || uVar12 < 0x18) && bVar18 || !bVar2) goto LAB_0025d80b;
      break;
    case CMP0130:
    case CMP0131:
    case CMP0132:
    case CMP0133:
    case CMP0134:
    case CMP0135:
    case CMP0136:
    case CMP0137:
    case CMP0138:
    case CMP0139:
      bVar5 = minorVer == 0x18 && bVar19 || uVar12 < 0x19;
joined_r0x0025da12:
      if ((!bVar5 || !bVar18) && bVar2) break;
LAB_0025d80b:
      pcVar10 = idToString(PVar13);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,pcVar10,&local_235);
      std::operator+(&defaultVar,"CMAKE_POLICY_DEFAULT_",&local_1e8);
      __lhs = cmMakefile::GetSafeDefinition(mf,&defaultVar);
      bVar3 = std::operator==(__lhs,"NEW");
      bVar5 = true;
      if (bVar3) {
        status = NEW;
      }
      else {
        bVar4 = std::operator==(__lhs,"OLD");
        status = OLD;
        if ((!bVar4) && (status = WARN, __lhs->_M_string_length != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar9 = std::operator<<((ostream *)&e,(string *)&defaultVar);
          poVar9 = std::operator<<(poVar9," has value \"");
          poVar9 = std::operator<<(poVar9,(string *)__lhs);
          std::operator<<(poVar9,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).");
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          bVar5 = false;
        }
      }
      std::__cxx11::string::~string((string *)&defaultVar);
      if (bVar5) {
        bVar5 = cmMakefile::SetPolicy(mf,PVar13,status);
        std::__cxx11::string::~string((string *)&local_1e8);
        if (bVar5) {
          if (PVar13 == CMP0001 && !bVar3) {
            this = cmMakefile::GetState(mf);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&defaultVar);
            cVar8 = cmState::GetInitializedCacheValue(this,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            if (cVar8.Value == (string *)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&e,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator<char> *)&defaultVar
                        );
              cmMakefile::AddCacheDefinition
                        (mf,(string *)&e,"2.4",
                         "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                         ,STRING,false);
              std::__cxx11::string::~string((string *)&e);
            }
          }
          goto LAB_0025da30;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      goto LAB_0025ddd9;
    case CMP0140:
    case CMP0141:
    case CMP0142:
      if ((minorVer == 0x19 && bVar19 || uVar12 < 0x1a) && bVar18 || !bVar2) goto LAB_0025d80b;
    }
    bVar5 = cmMakefile::SetPolicy(mf,PVar13,NEW);
    if (!bVar5) goto LAB_0025ddd9;
LAB_0025da30:
  }
  if (ancientPolicies.
      super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>._M_impl.
      super__Vector_impl_data._M_start ==
      ancientPolicies.
      super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar9 = std::operator<<((ostream *)&e,
                             "The project requests behavior compatible with CMake version \"");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9,".");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9,".");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::operator<<(poVar9,"\", which requires the OLD behavior for some policies:\n");
    pPVar1 = ancientPolicies.
             super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (pPVar14 = ancientPolicies.
                   super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
                   _M_impl.super__Vector_impl_data._M_start; pPVar14 != pPVar1;
        pPVar14 = pPVar14 + 1) {
      PVar13 = *pPVar14;
      poVar9 = std::operator<<((ostream *)&e,"  ");
      pcVar10 = idToString(PVar13);
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9,": ");
      pcVar10 = idToShortDescription(PVar13);
      poVar9 = std::operator<<(poVar9,pcVar10);
      std::operator<<(poVar9,"\n");
    }
    poVar9 = std::operator<<((ostream *)&e,
                             "However, this version of CMake no longer supports the OLD ");
    poVar9 = std::operator<<(poVar9,"behavior for these policies.  ");
    poVar9 = std::operator<<(poVar9,"Please either update your CMakeLists.txt files to conform to ")
    ;
    poVar9 = std::operator<<(poVar9,"the new behavior or use an older version of CMake that still ")
    ;
    std::operator<<(poVar9,"supports the old behavior.");
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&defaultVar);
    std::__cxx11::string::~string((string *)&defaultVar);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    cmSystemTools::s_FatalErrorOccurred = true;
LAB_0025ddd9:
    bVar2 = false;
  }
  std::_Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::~_Vector_base
            (&ancientPolicies.
              super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>);
  return bVar2;
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer,
                                    WarnCompat warnCompat)
{
  // Warn about policy versions for which support will be removed.
  if (warnCompat == WarnCompat::On &&
      (majorVer < 2 || (majorVer == 2 && minorVer < 8) ||
       (majorVer == 2 && minorVer == 8 && patchVer < 12)) &&
      // Avoid warning on calls generated by install(EXPORT)
      // in CMake versions prior to 3.18.
      !(majorVer == 2 && minorVer == 6 && patchVer == 0 &&
        mf->GetStateSnapshot().CanPopPolicyScope() &&
        cmSystemTools::Strucmp(mf->GetBacktrace().Top().Name.c_str(),
                               "cmake_policy") == 0)) {
    mf->IssueMessage(
      MessageType::DEPRECATION_WARNING,
      "Compatibility with CMake < 2.8.12 will be removed from "
      "a future version of CMake.\n"
      "Update the VERSION argument <min> value or use a ...<max> suffix "
      "to tell CMake that the project does not need compatibility with "
      "older versions.");
  }

  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = static_cast<PolicyID>(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}